

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,AssetPath *asset)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  string quote_str;
  string in_s;
  string s;
  long *local_90;
  char *local_88;
  long local_80 [2];
  long *local_70;
  ulong local_68;
  long local_60 [2];
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pcVar2 = (asset->asset_path_)._M_dataplus._M_p;
  local_70 = local_60;
  __cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (asset->asset_path_)._M_string_length);
  if (local_68 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(ofs,"@@",2);
  }
  else {
    local_90 = local_80;
    __cxx11::string::_M_construct<char_const*>((string *)&local_90,"@","");
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    lVar3 = std::__cxx11::string::find((char)&local_70,0x40);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_50);
    }
    else {
      if (local_68 != 0) {
        uVar5 = 0;
        do {
          uVar1 = uVar5 + 2;
          if (uVar1 < local_68) {
            if (((*(char *)((long)local_70 + uVar5) == '@') &&
                (*(char *)((long)local_70 + uVar5 + 1) == '@')) &&
               (*(char *)((long)local_70 + uVar1) == '@')) {
              std::__cxx11::string::append((char *)&local_50);
              uVar5 = uVar1;
            }
            else {
              std::__cxx11::string::push_back((char)&local_50);
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_68);
      }
      std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x3e4c8b);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(ofs,(char *)local_90,(long)local_88)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_90,(long)local_88);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::AssetPath &asset) {
  std::string in_s = asset.GetAssetPath();

  if (in_s.empty()) {
    ofs << "@@";
  } else {
    std::string quote_str = "@";

    std::string s;

    if (tinyusdz::contains(in_s, '@')) {
      // Escape '@@@'(to '\@@@') if the input path contains '@@@'
      for (size_t i = 0; i < in_s.length(); i++) {
        if ((i + 2) < in_s.length()) {
          if (in_s[i] == '@' && in_s[i + 1] == '@' && in_s[i + 2] == '@') {
            s += "\\@@@";
            i += 2;
          } else {
            s += in_s[i];
          }
        }
      }

      quote_str = "@@@";
    } else {
      s = in_s;
    }

    // Do not escape backslash for asset path
    ofs << quote_str << s << quote_str;
  }

  return ofs;
}